

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

FFSEncodeVector copy_all_to_FFSBuffer(FFSBuffer buf,FFSEncodeVector vec)

{
  void *pvVar1;
  FFSEncodeVector pFVar2;
  long lVar3;
  long lVar4;
  long *__ptr;
  ssize_t sVar5;
  long lVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 uVar9;
  long *plVar10;
  size_t s;
  FFSEncodeVector pFVar11;
  
  pvVar1 = buf->tmp_buffer;
  s = 0xfffffffffffffff8;
  do {
    lVar6 = s * 2;
    s = s + 8;
  } while (*(long *)((long)&vec[1].iov_base + lVar6) != 0);
  __ptr = (long *)ffs_malloc(s);
  pvVar8 = vec->iov_base;
  if (pvVar8 != (void *)0x0) {
    pvVar7 = buf->tmp_buffer;
    lVar6 = 0;
    do {
      if ((pvVar8 < pvVar7) || ((void *)(buf->tmp_buffer_size + (long)pvVar7) <= pvVar8)) {
        uVar9 = 0;
      }
      else {
        *(long *)((long)&vec->iov_base + lVar6 * 2) = (long)pvVar8 + (1 - (long)pvVar7);
        uVar9 = 1;
      }
      *(undefined8 *)((long)__ptr + lVar6) = uVar9;
      pvVar8 = *(void **)((long)&vec[1].iov_base + lVar6 * 2);
      lVar6 = lVar6 + 8;
    } while (pvVar8 != (void *)0x0);
  }
  if (*(long *)((long)vec + ((long)buf->tmp_buffer - (long)pvVar1)) != 0) {
    lVar3 = (long)buf->tmp_buffer - (long)pvVar1;
    lVar6 = 0x10;
    plVar10 = __ptr;
    do {
      if (*plVar10 == 0) {
        sVar5 = add_to_tmp_buffer(buf,*(size_t *)((long)&vec->iov_len + lVar3));
        pvVar8 = buf->tmp_buffer;
        memcpy((void *)((long)pvVar8 + sVar5),
               *(void **)((long)vec + (long)pvVar8 + ((lVar6 + -0x10) - (long)pvVar1)),
               *(size_t *)((long)vec + (long)pvVar8 + ((lVar6 + -8) - (long)pvVar1)));
        *(ssize_t *)((long)vec + (long)pvVar8 + ((lVar6 + -0x10) - (long)pvVar1)) = sVar5 + 1;
      }
      lVar3 = (long)buf->tmp_buffer + (lVar6 - (long)pvVar1);
      plVar10 = plVar10 + 1;
      lVar4 = lVar6 - (long)pvVar1;
      lVar6 = lVar6 + 0x10;
    } while (*(long *)((long)vec + (long)buf->tmp_buffer + lVar4) != 0);
  }
  free(__ptr);
  pvVar8 = buf->tmp_buffer;
  pvVar7 = *(void **)((long)vec + ((long)pvVar8 - (long)pvVar1));
  pFVar11 = (FFSEncodeVector)((long)vec + ((long)pvVar8 - (long)pvVar1));
  if (pvVar7 != (void *)0x0) {
    pFVar2 = pFVar11;
    do {
      if ((0 < (long)pvVar7) && (pvVar7 <= (void *)buf->tmp_buffer_size)) {
        pFVar2->iov_base = (void *)((long)pvVar7 + (long)pvVar8 + -1);
      }
      pvVar7 = pFVar2[1].iov_base;
      pFVar2 = pFVar2 + 1;
    } while (pvVar7 != (void *)0x0);
  }
  return pFVar11;
}

Assistant:

extern FFSEncodeVector
copy_all_to_FFSBuffer(FFSBuffer buf, FFSEncodeVector vec)
{
    int i = 0;
    intptr_t vec_offset = (intptr_t) vec - (intptr_t)buf->tmp_buffer;
    /* 
     * vec and some of the buffers may be in the memory managed by the
     * FFSBuffer.  The goal here to is put *everything* into the FFSBuffer.
     */
    int vec_count = 0;
    while (vec[vec_count].iov_base != NULL) {
      vec_count++;
    }
    assert(((uintptr_t)vec >= (uintptr_t)buf->tmp_buffer) && 
	   ((uintptr_t)vec < (uintptr_t)buf->tmp_buffer + buf->tmp_buffer_size));
    {
	size_t* already_in = malloc(sizeof(already_in[0]) * vec_count);
	while (vec[i].iov_base != NULL) {
	    if (((char*)vec[i].iov_base >= (char*)buf->tmp_buffer) &&
		((char*)vec[i].iov_base < (char*)buf->tmp_buffer + buf->tmp_buffer_size)) {
	        /* 
		 * remap pointers into temp so that they're offsets (must do
		 * this before we realloc the temp
		 */ 
	        vec[i].iov_base = (void*)((char *)vec[i].iov_base - (char *)buf->tmp_buffer + 1);
		already_in[i] = 1;
	    } else {
		already_in[i] = 0;
	    }
	    i++;
	}

	i = 0;
	while (((FFSEncodeVector)((intptr_t)buf->tmp_buffer + vec_offset))[i].iov_base !=
	       NULL) {
	    FFSEncodeVector v = (void*)((intptr_t) buf->tmp_buffer + vec_offset);
	    if (already_in[i] == 0) {
	        /* if this is an external buffer, copy it */
	        ssize_t offset = add_to_tmp_buffer(buf, v[i].iov_len);
		char * data = (char *) buf->tmp_buffer + offset;
		/* add_to_tmp_buffer() might have remapped vector */
		v = (void*)((char *) buf->tmp_buffer + vec_offset);
		memcpy(data, v[i].iov_base, v[i].iov_len);
		v[i].iov_base = (void*)(intptr_t)(offset + 1);
	    }
	    i++;
	}
	free(already_in);
    }
    /* reallocation done now */
    vec = (void*)((intptr_t)buf->tmp_buffer + vec_offset);
    i = 0;
    while (vec[i].iov_base != NULL) {
	if (((intptr_t)vec[i].iov_base > 0) &&
	    ((uintptr_t)vec[i].iov_base <= (uintptr_t)buf->tmp_buffer_size)) {
	    /* 
	     * remap pointers into temp so that they're addresses
	     */ 
	    vec[i].iov_base = (void*)((intptr_t)vec[i].iov_base + (char *)buf->tmp_buffer - 1);
	}
	i++;
    }
    return vec;
}